

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall SmallVector_CtorCopy_Test::TestBody(SmallVector_CtorCopy_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  initializer_list<int> init;
  AssertionResult gtest_ar;
  small_vector<int,_3UL> c;
  small_vector<int,_3UL> b;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  small_vector<int,_3UL> local_78;
  small_vector<int,_3UL> local_40;
  
  local_78.elements_ = (size_t)&DAT_500000003;
  init._M_len = 2;
  init._M_array = (iterator)&local_78;
  pstore::small_vector<int,_3UL>::small_vector(&local_40,init);
  pstore::small_vector<int,_3UL>::small_vector(&local_78,&local_40);
  local_90.data_._0_4_ = 2;
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.elements_
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_88,"2U","c.size ()",(uint *)&local_90,(unsigned_long *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_300000005;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_88,(char *)&local_98,(small_vector<int,_3UL> *)0x204375);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST (SmallVector, CtorCopy) {
    pstore::small_vector<int, 3> const b{3, 5};
    pstore::small_vector<int, 3> c = b;
    EXPECT_EQ (2U, c.size ());
    EXPECT_THAT (c, ::testing::ElementsAre (3, 5));
}